

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O1

TRef fold_bufstr_kfold_cse(jit_State *J)

{
  IRRef1 IVar1;
  ushort uVar2;
  IRIns *pIVar3;
  bool bVar4;
  TRef TVar5;
  IRIns *in_RAX;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  IROp1 IVar11;
  
  if ((J->flags >> 0x10 & 1) != 0) {
    IVar11 = (J->fold).left[0].field_1.o;
    if (IVar11 == 'T') {
      in_RAX = (J->cur).ir;
      uVar8 = (ulong)(J->fold).left[0].field_0.op1;
      bVar4 = true;
      if ((*(char *)((long)in_RAX + uVar8 * 8 + 5) == 'S') &&
         ((*(byte *)((long)in_RAX + uVar8 * 8 + 2) & 1) == 0)) {
        in_RAX = (IRIns *)(ulong)(J->fold).left[0].field_0.op2;
        bVar4 = false;
      }
      if (!bVar4) {
        return (TRef)in_RAX;
      }
    }
    else if (IVar11 == 'S') {
      if (((ulong)(J->fold).left[0] & 0x10000) == 0) {
        TVar5 = lj_ir_kgc(J,(GCobj *)(J[-1].penalty + 0x3a),IRT_STR);
        return TVar5;
      }
      IVar1 = (J->fold).left[0].field_0.prev;
      (J->fold).ins.field_0.op1 = (J->fold).left[0].field_0.op1;
      (J->fold).ins.field_0.op2 = IVar1;
      TVar5 = lj_opt_cse(J);
      return TVar5;
    }
  }
  if ((J->flags >> 0x11 & 1) != 0) {
    uVar7 = (uint)J->chain[0x55];
    do {
      uVar6 = uVar7;
      TVar5 = (TRef)in_RAX;
      if (uVar6 == 0) break;
      pIVar3 = (J->cur).ir;
      IVar11 = (J->fold).left[0].field_1.o;
      if (IVar11 == *(IROp1 *)((long)pIVar3 + (ulong)pIVar3[uVar6].field_0.op1 * 8 + 5)) {
        pIVar9 = pIVar3 + pIVar3[uVar6].field_0.op1;
        pIVar10 = (J->fold).left;
        do {
          uVar2 = (pIVar10->field_0).op2;
          if (uVar2 != (pIVar9->field_0).op2) break;
          if ((IVar11 == 'S') && ((uVar2 & 1) == 0)) {
            bVar4 = false;
            in_RAX = (IRIns *)(ulong)uVar6;
            uVar7 = uVar6;
            goto LAB_00148ca4;
          }
          if (IVar11 == '_' && uVar2 == 0x17) break;
          pIVar10 = pIVar3 + (pIVar10->field_0).op1;
          pIVar9 = pIVar3 + (pIVar9->field_0).op1;
          IVar11 = (pIVar10->field_1).o;
        } while (IVar11 == (pIVar9->field_1).o);
      }
      bVar4 = true;
      uVar7 = (uint)*(ushort *)((long)pIVar3 + (ulong)uVar6 * 8 + 6);
LAB_00148ca4:
      TVar5 = (TRef)in_RAX;
    } while (bVar4);
    if (uVar6 != 0) {
      return TVar5;
    }
  }
  TVar5 = lj_ir_emit(J);
  return TVar5;
}

Assistant:

LJFOLD(BUFSTR any any)
LJFOLDF(bufstr_kfold_cse)
{
  lj_assertJ(fleft->o == IR_BUFHDR || fleft->o == IR_BUFPUT ||
	     fleft->o == IR_CALLL,
	     "bad buffer constructor IR op %d", fleft->o);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_FOLD)) {
    if (fleft->o == IR_BUFHDR) {  /* No put operations? */
      if (!(fleft->op2 & IRBUFHDR_APPEND))  /* Empty buffer? */
	return lj_ir_kstr(J, &J2G(J)->strempty);
      fins->op1 = fleft->op1;
      fins->op2 = fleft->prev;  /* Relies on checks in bufput_append. */
      return CSEFOLD;
    } else if (fleft->o == IR_BUFPUT) {
      IRIns *irb = IR(fleft->op1);
      if (irb->o == IR_BUFHDR && !(irb->op2 & IRBUFHDR_APPEND))
	return fleft->op2;  /* Shortcut for a single put operation. */
    }
  }
  /* Try to CSE the whole chain. */
  if (LJ_LIKELY(J->flags & JIT_F_OPT_CSE)) {
    IRRef ref = J->chain[IR_BUFSTR];
    while (ref) {
      IRIns *irs = IR(ref), *ira = fleft, *irb = IR(irs->op1);
      while (ira->o == irb->o && ira->op2 == irb->op2) {
	lj_assertJ(ira->o == IR_BUFHDR || ira->o == IR_BUFPUT ||
		   ira->o == IR_CALLL || ira->o == IR_CARG,
		   "bad buffer constructor IR op %d", ira->o);
	if (ira->o == IR_BUFHDR && !(ira->op2 & IRBUFHDR_APPEND))
	  return ref;  /* CSE succeeded. */
	if (ira->o == IR_CALLL && ira->op2 == IRCALL_lj_buf_puttab)
	  break;
	ira = IR(ira->op1);
	irb = IR(irb->op1);
      }
      ref = irs->prev;
    }
  }
  return EMITFOLD;  /* No CSE possible. */
}